

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O1

bool operator<(BigNumber *b1,BigNumber *b2)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  BigNumber local_68;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  pcVar1 = (b1->_numberString)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (b1->_numberString)._M_string_length);
  if (local_40 == (b2->_numberString)._M_string_length) {
    if (local_40 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_48,(b2->_numberString)._M_dataplus._M_p,local_40);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (bVar3) {
    bVar3 = false;
  }
  else {
    local_68._numberString._M_dataplus._M_p = (pointer)&local_68._numberString.field_2;
    pcVar1 = (b1->_numberString)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (b1->_numberString)._M_string_length);
    bVar3 = operator>(&local_68,b2);
    bVar3 = !bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._numberString._M_dataplus._M_p != &local_68._numberString.field_2) {
      operator_delete(local_68._numberString._M_dataplus._M_p,
                      local_68._numberString.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar3;
}

Assistant:

bool operator<(BigNumber b1, const BigNumber &b2) {
    return !(b1 == b2) && !(b1 > b2);
}